

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderLibraryCase.cpp
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
deqp::gls::generateVertexSpecialization_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,gls *this,ProgramSpecializationParams *specParams)

{
  Value *pVVar1;
  bool bVar2;
  DataType DVar3;
  char *pcVar4;
  ostream *poVar5;
  Value *pVVar6;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_basic_string<char>_>_>::value,_pair<iterator,_bool>_>
  _Var7;
  allocator<char> local_499;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_478;
  _Base_ptr local_438;
  undefined1 local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_408;
  _Base_ptr local_3c8;
  undefined1 local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_398;
  char *local_358;
  char *floatTypeStr;
  char *pcStack_348;
  DataType floatType;
  char *typeStr;
  const_reference pvStack_338;
  DataType basicType;
  Value *val;
  size_t ndx;
  ostringstream local_318 [8];
  ostringstream setup;
  ostringstream local_1a0 [8];
  ostringstream decl;
  char *vtxIn;
  bool usesInout;
  ProgramSpecializationParams *specParams_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *params;
  
  bVar2 = glu::glslVersionUsesInOutQualifiers(*(GLSLVersion *)(*(long *)this + 8));
  pcVar4 = "attribute";
  if (bVar2) {
    pcVar4 = "in";
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__cxx11::ostringstream::ostringstream(local_318);
  ndx._3_1_ = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(__return_storage_ptr__);
  poVar5 = std::operator<<((ostream *)local_1a0,pcVar4);
  std::operator<<(poVar5," highp vec4 dEQP_Position;\n");
  for (val = (Value *)0x0; pVVar1 = val,
      pVVar6 = (Value *)std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::size
                                  ((vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *)
                                   (*(long *)this + 0x30)), pVVar1 < pVVar6;
      val = (Value *)((long)&(val->type).m_type + 1)) {
    pvStack_338 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator[]
                            ((vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *)
                             (*(long *)this + 0x30),(size_type)val);
    typeStr._4_4_ = glu::VarType::getBasicType(&pvStack_338->type);
    DVar3 = glu::VarType::getBasicType(&pvStack_338->type);
    pcStack_348 = glu::getDataTypeName(DVar3);
    DVar3 = glu::getDataTypeScalarType(typeStr._4_4_);
    if (DVar3 == TYPE_FLOAT) {
      poVar5 = std::operator<<((ostream *)local_1a0,pcVar4);
      poVar5 = std::operator<<(poVar5," ");
      poVar5 = std::operator<<(poVar5,pcStack_348);
      poVar5 = std::operator<<(poVar5," ");
      poVar5 = std::operator<<(poVar5,(string *)&pvStack_338->name);
      std::operator<<(poVar5,";\n");
    }
    else {
      floatTypeStr._4_4_ = glu::getDataTypeFloatScalars(typeStr._4_4_);
      local_358 = glu::getDataTypeName(floatTypeStr._4_4_);
      poVar5 = std::operator<<((ostream *)local_1a0,pcVar4);
      poVar5 = std::operator<<(poVar5," ");
      poVar5 = std::operator<<(poVar5,local_358);
      poVar5 = std::operator<<(poVar5," a_");
      poVar5 = std::operator<<(poVar5,(string *)&pvStack_338->name);
      std::operator<<(poVar5,";\n");
      poVar5 = std::operator<<((ostream *)local_318,pcStack_348);
      poVar5 = std::operator<<(poVar5," ");
      poVar5 = std::operator<<(poVar5,(string *)&pvStack_338->name);
      poVar5 = std::operator<<(poVar5," = ");
      poVar5 = std::operator<<(poVar5,pcStack_348);
      poVar5 = std::operator<<(poVar5,"(a_");
      poVar5 = std::operator<<(poVar5,(string *)&pvStack_338->name);
      std::operator<<(poVar5,");\n");
    }
  }
  generateUniformDeclarations((ostream *)local_1a0,(ValueBlock *)(*(long *)this + 0x30));
  std::__cxx11::ostringstream::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[20],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_398,(char (*) [20])"VERTEX_DECLARATIONS",&local_3b8);
  _Var7 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)__return_storage_ptr__,&local_398);
  local_3c8 = (_Base_ptr)_Var7.first._M_node;
  local_3c0 = _Var7.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::ostringstream::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_408,(char (*) [13])"VERTEX_SETUP",&local_428);
  _Var7 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)__return_storage_ptr__,&local_408);
  local_438 = (_Base_ptr)_Var7.first._M_node;
  local_430 = _Var7.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_408);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498,"gl_Position = dEQP_Position;\n",&local_499);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_478,(char (*) [14])"VERTEX_OUTPUT",&local_498);
  std::
  map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)__return_storage_ptr__,&local_478);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_478);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator(&local_499);
  ndx._3_1_ = 1;
  std::__cxx11::ostringstream::~ostringstream(local_318);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

static map<string, string> generateVertexSpecialization (const ProgramSpecializationParams& specParams)
{
	const bool				usesInout	= glslVersionUsesInOutQualifiers(specParams.caseSpec.targetVersion);
	const char*				vtxIn		= usesInout ? "in" : "attribute";
	ostringstream			decl;
	ostringstream			setup;
	map<string, string>		params;

	decl << vtxIn << " highp vec4 dEQP_Position;\n";

	for (size_t ndx = 0; ndx < specParams.caseSpec.values.inputs.size(); ndx++)
	{
		const Value&		val			= specParams.caseSpec.values.inputs[ndx];
		const DataType		basicType	= val.type.getBasicType();
		const char* const	typeStr		= getDataTypeName(val.type.getBasicType());

		if (getDataTypeScalarType(basicType) == TYPE_FLOAT)
		{
			decl << vtxIn << " " << typeStr << " " << val.name << ";\n";
		}
		else
		{
			const DataType		floatType		= getDataTypeFloatScalars(basicType);
			const char* const	floatTypeStr	= getDataTypeName(floatType);

			decl << vtxIn << " " << floatTypeStr << " a_" << val.name << ";\n";
			setup << typeStr << " " << val.name << " = " << typeStr << "(a_" << val.name << ");\n";
		}
	}

	generateUniformDeclarations(decl, specParams.caseSpec.values);

	params.insert(pair<string, string>("VERTEX_DECLARATIONS",	decl.str()));
	params.insert(pair<string, string>("VERTEX_SETUP",			setup.str()));
	params.insert(pair<string, string>("VERTEX_OUTPUT",			string("gl_Position = dEQP_Position;\n")));

	return params;
}